

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall Context<true>::PopNamespace(Context<true> *this)

{
  uchar uVar1;
  BaseState<true> *pBVar2;
  uchar *puVar3;
  pointer pNVar4;
  char feature_group;
  uchar local_9;
  
  pNVar4 = (this->namespace_path).
           super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar4[-1].feature_count != 0) {
    uVar1 = pNVar4[-1].feature_group;
    puVar3 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((this->ex->super_example_predict).indices._begin,
                        (this->ex->super_example_predict).indices._end);
    if (puVar3 == (this->ex->super_example_predict).indices._end) {
      local_9 = uVar1;
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this->ex,&local_9);
    }
    pNVar4 = (this->namespace_path).
             super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pBVar2 = pNVar4[-1].return_state;
  (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pNVar4 + -1;
  return pBVar2;
}

Assistant:

BaseState<audit>* PopNamespace()
  {
    auto& ns = CurrentNamespace();
    if (ns.feature_count > 0)
    {
      auto feature_group = ns.feature_group;
      // Do not insert feature_group if it already exists.
      if(std::find(ex->indices.begin(), ex->indices.end(), feature_group) == ex->indices.end())
      {
        ex->indices.push_back(feature_group);
      }
    }

    auto return_state = namespace_path.back().return_state;
    namespace_path.pop_back();
    return return_state;
  }